

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

string * __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::programKeyFromRules
          (string *__return_storage_ptr__,GLEngine *this,string *programName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rules,ShaderReplacementDefaults defaults)

{
  pointer pbVar1;
  ostream *poVar2;
  long lVar3;
  string *s_1;
  string *s;
  pointer pbVar4;
  stringstream builder;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"$PROGRAMNAME: ",0xe);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(programName->_M_dataplus)._M_p,programName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"#",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"  $RULES: ",10);
  pbVar1 = (rules->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (rules->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# ",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"  $DEFAULTS: ",0xd);
  switch(defaults) {
  case SceneObject:
    pbVar1 = (this->super_Engine).defaultRules_sceneObject.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = (this->super_Engine).defaultRules_sceneObject.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
    {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# ",2);
    }
    break;
  case SceneObjectNoSlice:
    pbVar1 = (this->super_Engine).defaultRules_sceneObject.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = (this->super_Engine).defaultRules_sceneObject.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
    {
      lVar3 = std::__cxx11::string::rfind((char *)pbVar4,0x527c88,0);
      if (lVar3 != 0) {
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# ",2);
      }
    }
    break;
  case Pick:
    pbVar1 = (this->super_Engine).defaultRules_pick.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = (this->super_Engine).defaultRules_pick.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
    {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# ",2);
    }
    break;
  case Process:
    pbVar1 = (this->super_Engine).defaultRules_process.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = (this->super_Engine).defaultRules_process.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
    {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# ",2);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string GLEngine::programKeyFromRules(const std::string& programName, const std::vector<std::string>& rules,
                                          ShaderReplacementDefaults defaults) {

  std::stringstream builder;

  // program name comes first
  builder << "$PROGRAMNAME: ";
  builder << programName << "#";

  // then rules
  builder << "  $RULES: ";
  for (const std::string& s : rules) builder << s << "# ";

  // then rules from the defaults
  builder << "  $DEFAULTS: ";
  switch (defaults) {
  case ShaderReplacementDefaults::SceneObject: {
    for (const std::string& s : defaultRules_sceneObject) builder << s << "# ";
    break;
  }
  case ShaderReplacementDefaults::SceneObjectNoSlice: {
    for (const std::string& s : defaultRules_sceneObject) {
      if (s.rfind("SLICE_PLANE_", 0) != 0) {
        builder << s << "# ";
      }
    }
    break;
  }
  case ShaderReplacementDefaults::Pick: {
    for (const std::string& s : defaultRules_pick) builder << s << "# ";
    break;
  }
  case ShaderReplacementDefaults::Process: {
    for (const std::string& s : defaultRules_process) builder << s << "# ";
    break;
  }
  case ShaderReplacementDefaults::None: {
    break;
  }
  }

  return builder.str();
}